

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int skip_sep(LexState *ls)

{
  long lVar1;
  byte *pbVar2;
  uint c;
  uint *in_RDI;
  int s;
  int count;
  int local_1c;
  uint in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  uint uVar3;
  
  local_1c = 0;
  uVar3 = *in_RDI;
  save((LexState *)(ulong)uVar3,in_stack_ffffffffffffffec);
  lVar1 = **(long **)(in_RDI + 0x10);
  **(long **)(in_RDI + 0x10) = lVar1 + -1;
  if (lVar1 == 0) {
    c = luaZ_fill((ZIO *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  }
  else {
    pbVar2 = *(byte **)(*(long *)(in_RDI + 0x10) + 8);
    *(byte **)(*(long *)(in_RDI + 0x10) + 8) = pbVar2 + 1;
    c = (uint)*pbVar2;
  }
  *in_RDI = c;
  while (*in_RDI == 0x3d) {
    save((LexState *)CONCAT44(local_1c,uVar3),c);
    lVar1 = **(long **)(in_RDI + 0x10);
    **(long **)(in_RDI + 0x10) = lVar1 + -1;
    if (lVar1 == 0) {
      in_stack_ffffffffffffffe8 = luaZ_fill((ZIO *)CONCAT44(c,in_stack_ffffffffffffffe8));
    }
    else {
      pbVar2 = *(byte **)(*(long *)(in_RDI + 0x10) + 8);
      *(byte **)(*(long *)(in_RDI + 0x10) + 8) = pbVar2 + 1;
      in_stack_ffffffffffffffe8 = (uint)*pbVar2;
    }
    *in_RDI = in_stack_ffffffffffffffe8;
    local_1c = local_1c + 1;
  }
  if (*in_RDI != uVar3) {
    local_1c = -1 - local_1c;
  }
  return local_1c;
}

Assistant:

static int skip_sep(LexState*ls){
int count=0;
int s=ls->current;
save_and_next(ls);
while(ls->current=='='){
save_and_next(ls);
count++;
}
return(ls->current==s)?count:(-count)-1;
}